

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_paeth_predictor_64x64_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  ushort uVar63;
  undefined1 auVar64 [15];
  ushort uVar65;
  undefined1 auVar66 [15];
  ushort uVar67;
  undefined1 auVar68 [15];
  ushort uVar69;
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  unkuint9 Var92;
  undefined1 auVar93 [11];
  undefined1 auVar94 [15];
  unkuint9 Var95;
  undefined1 auVar96 [11];
  undefined1 auVar97 [15];
  unkuint9 Var98;
  undefined1 auVar99 [11];
  undefined1 auVar100 [15];
  unkuint9 Var101;
  undefined1 auVar102 [11];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [16];
  long lVar112;
  int iVar113;
  undefined4 uVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  short sVar117;
  short sVar118;
  short sVar127;
  short sVar128;
  short sVar129;
  short sVar130;
  short sVar133;
  short sVar136;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  short sVar139;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar152 [16];
  undefined1 auVar160 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  short sVar178;
  short sVar179;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short sStack_150;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  byte bVar131;
  byte bVar132;
  byte bVar134;
  byte bVar135;
  byte bVar137;
  byte bVar138;
  byte bVar140;
  byte bVar145;
  byte bVar146;
  byte bVar147;
  byte bVar148;
  byte bVar149;
  byte bVar150;
  byte bVar151;
  byte bVar153;
  byte bVar154;
  byte bVar155;
  byte bVar156;
  byte bVar157;
  byte bVar158;
  byte bVar159;
  byte bVar161;
  byte bVar162;
  byte bVar163;
  byte bVar164;
  byte bVar165;
  byte bVar166;
  byte bVar167;
  short sVar177;
  short sVar191;
  short sVar220;
  
  auVar115 = *(undefined1 (*) [16])above;
  auVar120 = *(undefined1 (*) [16])(above + 0x10);
  auVar121 = *(undefined1 (*) [16])(above + 0x20);
  auVar122 = *(undefined1 (*) [16])(above + 0x30);
  auVar59[0xd] = 0;
  auVar59._0_13_ = auVar115._0_13_;
  auVar59[0xe] = auVar115[7];
  uVar63 = auVar59._13_2_;
  auVar64[0xc] = auVar115[6];
  auVar64._0_12_ = auVar115._0_12_;
  auVar64._13_2_ = uVar63;
  auVar71[0xb] = 0;
  auVar71._0_11_ = auVar115._0_11_;
  auVar71._12_3_ = auVar64._12_3_;
  auVar75[10] = auVar115[5];
  auVar75._0_10_ = auVar115._0_10_;
  auVar75._11_4_ = auVar71._11_4_;
  auVar79[9] = 0;
  auVar79._0_9_ = auVar115._0_9_;
  auVar79._10_5_ = auVar75._10_5_;
  auVar83[8] = auVar115[4];
  auVar83._0_8_ = auVar115._0_8_;
  auVar83._9_6_ = auVar79._9_6_;
  auVar91._7_8_ = 0;
  auVar91._0_7_ = auVar83._8_7_;
  Var92 = CONCAT81(SUB158(auVar91 << 0x40,7),auVar115[3]);
  auVar103._9_6_ = 0;
  auVar103._0_9_ = Var92;
  auVar93._1_10_ = SUB1510(auVar103 << 0x30,5);
  auVar93[0] = auVar115[2];
  auVar104._11_4_ = 0;
  auVar104._0_11_ = auVar93;
  auVar87[2] = auVar115[1];
  auVar87._0_2_ = auVar115._0_2_;
  auVar87._3_12_ = SUB1512(auVar104 << 0x20,3);
  auVar141._0_2_ = auVar115._0_2_ & 0xff;
  auVar141._2_13_ = auVar87._2_13_;
  auVar141[0xf] = 0;
  auVar152._0_2_ = CONCAT11(0,auVar115[8]);
  bVar153 = auVar115[9];
  auVar152[2] = bVar153;
  auVar152[3] = 0;
  bVar154 = auVar115[10];
  auVar152[4] = bVar154;
  auVar152[5] = 0;
  bVar155 = auVar115[0xb];
  auVar152[6] = bVar155;
  auVar152[7] = 0;
  bVar156 = auVar115[0xc];
  auVar152[8] = bVar156;
  auVar152[9] = 0;
  bVar157 = auVar115[0xd];
  auVar152[10] = bVar157;
  auVar152[0xb] = 0;
  bVar158 = auVar115[0xe];
  auVar152[0xc] = bVar158;
  auVar152[0xd] = 0;
  bVar159 = auVar115[0xf];
  auVar152[0xe] = bVar159;
  auVar152[0xf] = 0;
  auVar60[0xd] = 0;
  auVar60._0_13_ = auVar120._0_13_;
  auVar60[0xe] = auVar120[7];
  uVar65 = auVar60._13_2_;
  auVar66[0xc] = auVar120[6];
  auVar66._0_12_ = auVar120._0_12_;
  auVar66._13_2_ = uVar65;
  auVar72[0xb] = 0;
  auVar72._0_11_ = auVar120._0_11_;
  auVar72._12_3_ = auVar66._12_3_;
  auVar76[10] = auVar120[5];
  auVar76._0_10_ = auVar120._0_10_;
  auVar76._11_4_ = auVar72._11_4_;
  auVar80[9] = 0;
  auVar80._0_9_ = auVar120._0_9_;
  auVar80._10_5_ = auVar76._10_5_;
  auVar84[8] = auVar120[4];
  auVar84._0_8_ = auVar120._0_8_;
  auVar84._9_6_ = auVar80._9_6_;
  auVar94._7_8_ = 0;
  auVar94._0_7_ = auVar84._8_7_;
  Var95 = CONCAT81(SUB158(auVar94 << 0x40,7),auVar120[3]);
  auVar105._9_6_ = 0;
  auVar105._0_9_ = Var95;
  auVar96._1_10_ = SUB1510(auVar105 << 0x30,5);
  auVar96[0] = auVar120[2];
  auVar106._11_4_ = 0;
  auVar106._0_11_ = auVar96;
  auVar88[2] = auVar120[1];
  auVar88._0_2_ = auVar120._0_2_;
  auVar88._3_12_ = SUB1512(auVar106 << 0x20,3);
  auVar192._0_2_ = auVar120._0_2_ & 0xff;
  auVar192._2_13_ = auVar88._2_13_;
  auVar192[0xf] = 0;
  auVar119._0_2_ = CONCAT11(0,auVar120[8]);
  bVar131 = auVar120[9];
  auVar119[2] = bVar131;
  auVar119[3] = 0;
  bVar132 = auVar120[10];
  auVar119[4] = bVar132;
  auVar119[5] = 0;
  bVar134 = auVar120[0xb];
  auVar119[6] = bVar134;
  auVar119[7] = 0;
  bVar135 = auVar120[0xc];
  auVar119[8] = bVar135;
  auVar119[9] = 0;
  bVar137 = auVar120[0xd];
  auVar119[10] = bVar137;
  auVar119[0xb] = 0;
  bVar138 = auVar120[0xe];
  auVar119[0xc] = bVar138;
  auVar119[0xd] = 0;
  bVar140 = auVar120[0xf];
  auVar119[0xe] = bVar140;
  auVar119[0xf] = 0;
  auVar61[0xd] = 0;
  auVar61._0_13_ = auVar121._0_13_;
  auVar61[0xe] = auVar121[7];
  uVar67 = auVar61._13_2_;
  auVar68[0xc] = auVar121[6];
  auVar68._0_12_ = auVar121._0_12_;
  auVar68._13_2_ = uVar67;
  auVar73[0xb] = 0;
  auVar73._0_11_ = auVar121._0_11_;
  auVar73._12_3_ = auVar68._12_3_;
  auVar77[10] = auVar121[5];
  auVar77._0_10_ = auVar121._0_10_;
  auVar77._11_4_ = auVar73._11_4_;
  auVar81[9] = 0;
  auVar81._0_9_ = auVar121._0_9_;
  auVar81._10_5_ = auVar77._10_5_;
  auVar85[8] = auVar121[4];
  auVar85._0_8_ = auVar121._0_8_;
  auVar85._9_6_ = auVar81._9_6_;
  auVar97._7_8_ = 0;
  auVar97._0_7_ = auVar85._8_7_;
  Var98 = CONCAT81(SUB158(auVar97 << 0x40,7),auVar121[3]);
  auVar107._9_6_ = 0;
  auVar107._0_9_ = Var98;
  auVar99._1_10_ = SUB1510(auVar107 << 0x30,5);
  auVar99[0] = auVar121[2];
  auVar108._11_4_ = 0;
  auVar108._0_11_ = auVar99;
  auVar89[2] = auVar121[1];
  auVar89._0_2_ = auVar121._0_2_;
  auVar89._3_12_ = SUB1512(auVar108 << 0x20,3);
  auVar168._0_2_ = auVar121._0_2_ & 0xff;
  auVar168._2_13_ = auVar89._2_13_;
  auVar168[0xf] = 0;
  auVar160._0_2_ = CONCAT11(0,auVar121[8]);
  bVar161 = auVar121[9];
  auVar160[2] = bVar161;
  auVar160[3] = 0;
  bVar162 = auVar121[10];
  auVar160[4] = bVar162;
  auVar160[5] = 0;
  bVar163 = auVar121[0xb];
  auVar160[6] = bVar163;
  auVar160[7] = 0;
  bVar164 = auVar121[0xc];
  auVar160[8] = bVar164;
  auVar160[9] = 0;
  bVar165 = auVar121[0xd];
  auVar160[10] = bVar165;
  auVar160[0xb] = 0;
  bVar166 = auVar121[0xe];
  auVar160[0xc] = bVar166;
  auVar160[0xd] = 0;
  bVar167 = auVar121[0xf];
  auVar160[0xe] = bVar167;
  auVar160[0xf] = 0;
  auVar62[0xd] = 0;
  auVar62._0_13_ = auVar122._0_13_;
  auVar62[0xe] = auVar122[7];
  uVar69 = auVar62._13_2_;
  auVar70[0xc] = auVar122[6];
  auVar70._0_12_ = auVar122._0_12_;
  auVar70._13_2_ = uVar69;
  auVar74[0xb] = 0;
  auVar74._0_11_ = auVar122._0_11_;
  auVar74._12_3_ = auVar70._12_3_;
  auVar78[10] = auVar122[5];
  auVar78._0_10_ = auVar122._0_10_;
  auVar78._11_4_ = auVar74._11_4_;
  auVar82[9] = 0;
  auVar82._0_9_ = auVar122._0_9_;
  auVar82._10_5_ = auVar78._10_5_;
  auVar86[8] = auVar122[4];
  auVar86._0_8_ = auVar122._0_8_;
  auVar86._9_6_ = auVar82._9_6_;
  auVar100._7_8_ = 0;
  auVar100._0_7_ = auVar86._8_7_;
  Var101 = CONCAT81(SUB158(auVar100 << 0x40,7),auVar122[3]);
  auVar109._9_6_ = 0;
  auVar109._0_9_ = Var101;
  auVar102._1_10_ = SUB1510(auVar109 << 0x30,5);
  auVar102[0] = auVar122[2];
  auVar110._11_4_ = 0;
  auVar110._0_11_ = auVar102;
  auVar90[2] = auVar122[1];
  auVar90._0_2_ = auVar122._0_2_;
  auVar90._3_12_ = SUB1512(auVar110 << 0x20,3);
  auVar180._0_2_ = auVar122._0_2_ & 0xff;
  auVar180._2_13_ = auVar90._2_13_;
  auVar180[0xf] = 0;
  auVar144._0_2_ = CONCAT11(0,auVar122[8]);
  bVar145 = auVar122[9];
  auVar144[2] = bVar145;
  auVar144[3] = 0;
  bVar146 = auVar122[10];
  auVar144[4] = bVar146;
  auVar144[5] = 0;
  bVar147 = auVar122[0xb];
  auVar144[6] = bVar147;
  auVar144[7] = 0;
  bVar148 = auVar122[0xc];
  auVar144[8] = bVar148;
  auVar144[9] = 0;
  bVar149 = auVar122[0xd];
  auVar144[10] = bVar149;
  auVar144[0xb] = 0;
  bVar150 = auVar122[0xe];
  auVar144[0xc] = bVar150;
  auVar144[0xd] = 0;
  bVar151 = auVar122[0xf];
  auVar144[0xe] = bVar151;
  auVar144[0xf] = 0;
  auVar115 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  uVar114 = auVar115._0_4_;
  sVar178 = auVar115._0_2_;
  sVar179 = auVar115._2_2_;
  auVar115._0_2_ = auVar141._0_2_ - sVar178;
  auVar115._2_2_ = auVar87._2_2_ - sVar179;
  auVar115._4_2_ = auVar93._0_2_ - sVar178;
  sVar117 = (short)Var92;
  auVar115._6_2_ = sVar117 - sVar179;
  auVar115._8_2_ = auVar83._8_2_ - sVar178;
  auVar115._10_2_ = auVar75._10_2_ - sVar179;
  auVar115._12_2_ = auVar64._12_2_ - sVar178;
  auVar115._14_2_ = (uVar63 >> 8) - sVar179;
  auVar196._0_2_ = auVar152._0_2_ - sVar178;
  auVar196._2_2_ = (ushort)bVar153 - sVar179;
  auVar196._4_2_ = (ushort)bVar154 - sVar178;
  auVar196._6_2_ = (ushort)bVar155 - sVar179;
  auVar196._8_2_ = (ushort)bVar156 - sVar178;
  auVar196._10_2_ = (ushort)bVar157 - sVar179;
  auVar196._12_2_ = (ushort)bVar158 - sVar178;
  auVar196._14_2_ = (ushort)bVar159 - sVar179;
  auVar213._0_2_ = auVar192._0_2_ - sVar178;
  auVar213._2_2_ = auVar88._2_2_ - sVar179;
  auVar213._4_2_ = auVar96._0_2_ - sVar178;
  sVar220 = (short)Var95;
  auVar213._6_2_ = sVar220 - sVar179;
  auVar213._8_2_ = auVar84._8_2_ - sVar178;
  auVar213._10_2_ = auVar76._10_2_ - sVar179;
  auVar213._12_2_ = auVar66._12_2_ - sVar178;
  auVar213._14_2_ = (uVar65 >> 8) - sVar179;
  auVar120._0_2_ = auVar119._0_2_ - sVar178;
  auVar120._2_2_ = (ushort)bVar131 - sVar179;
  auVar120._4_2_ = (ushort)bVar132 - sVar178;
  auVar120._6_2_ = (ushort)bVar134 - sVar179;
  auVar120._8_2_ = (ushort)bVar135 - sVar178;
  auVar120._10_2_ = (ushort)bVar137 - sVar179;
  auVar120._12_2_ = (ushort)bVar138 - sVar178;
  auVar120._14_2_ = (ushort)bVar140 - sVar179;
  auVar169._0_2_ = auVar168._0_2_ - sVar178;
  auVar169._2_2_ = auVar89._2_2_ - sVar179;
  auVar169._4_2_ = auVar99._0_2_ - sVar178;
  sVar177 = (short)Var98;
  auVar169._6_2_ = sVar177 - sVar179;
  auVar169._8_2_ = auVar85._8_2_ - sVar178;
  auVar169._10_2_ = auVar77._10_2_ - sVar179;
  auVar169._12_2_ = auVar68._12_2_ - sVar178;
  auVar169._14_2_ = (uVar67 >> 8) - sVar179;
  auVar142._0_2_ = auVar160._0_2_ - sVar178;
  auVar142._2_2_ = (ushort)bVar161 - sVar179;
  auVar142._4_2_ = (ushort)bVar162 - sVar178;
  auVar142._6_2_ = (ushort)bVar163 - sVar179;
  auVar142._8_2_ = (ushort)bVar164 - sVar178;
  auVar142._10_2_ = (ushort)bVar165 - sVar179;
  auVar142._12_2_ = (ushort)bVar166 - sVar178;
  auVar142._14_2_ = (ushort)bVar167 - sVar179;
  auVar181._0_2_ = auVar180._0_2_ - sVar178;
  auVar181._2_2_ = auVar90._2_2_ - sVar179;
  auVar181._4_2_ = auVar102._0_2_ - sVar178;
  sVar191 = (short)Var101;
  auVar181._6_2_ = sVar191 - sVar179;
  auVar181._8_2_ = auVar86._8_2_ - sVar178;
  auVar181._10_2_ = auVar78._10_2_ - sVar179;
  auVar181._12_2_ = auVar70._12_2_ - sVar178;
  auVar181._14_2_ = (uVar69 >> 8) - sVar179;
  auVar193._0_2_ = auVar144._0_2_ - sVar178;
  auVar193._2_2_ = (ushort)bVar145 - sVar179;
  auVar193._4_2_ = (ushort)bVar146 - sVar178;
  auVar193._6_2_ = (ushort)bVar147 - sVar179;
  auVar193._8_2_ = (ushort)bVar148 - sVar178;
  auVar193._10_2_ = (ushort)bVar149 - sVar179;
  auVar193._12_2_ = (ushort)bVar150 - sVar178;
  auVar193._14_2_ = (ushort)bVar151 - sVar179;
  lVar112 = 0;
  auVar221 = pabsw(in_XMM14,auVar115);
  auVar206 = pabsw(in_XMM12,auVar196);
  auVar207 = pabsw(auVar206,auVar213);
  auVar121 = pabsw(auVar120,auVar120);
  auVar122 = pabsw(auVar121,auVar169);
  auVar123 = pabsw(auVar122,auVar142);
  auVar124 = pabsw(auVar123,auVar181);
  auVar125 = pabsw(auVar124,auVar193);
  do {
    auVar111 = *(undefined1 (*) [16])(left + lVar112 * 0x10);
    iVar113 = 0x10;
    auVar143 = _DAT_004d27e0;
    do {
      auVar126 = pshufb(auVar111,auVar143);
      sVar118 = auVar126._0_2_;
      sVar127 = auVar126._2_2_;
      sVar128 = auVar126._4_2_;
      sVar129 = auVar126._6_2_;
      sVar130 = auVar126._8_2_;
      sVar133 = auVar126._10_2_;
      sVar136 = auVar126._12_2_;
      sVar139 = auVar126._14_2_;
      auVar182._0_2_ = (auVar115._0_2_ + sVar118) - auVar141._0_2_;
      auVar182._2_2_ = (auVar115._2_2_ + sVar127) - auVar87._2_2_;
      auVar182._4_2_ = (auVar115._4_2_ + sVar128) - auVar93._0_2_;
      auVar182._6_2_ = (auVar115._6_2_ + sVar129) - sVar117;
      auVar182._8_2_ = (auVar115._8_2_ + sVar130) - auVar83._8_2_;
      auVar182._10_2_ = (auVar115._10_2_ + sVar133) - auVar75._10_2_;
      auVar182._12_2_ = (auVar115._12_2_ + sVar136) - auVar64._12_2_;
      auVar182._14_2_ = (auVar115._14_2_ + sVar139) - (uVar63 >> 8);
      auVar183 = pabsw(auVar182,auVar182);
      auVar195._0_2_ = (auVar115._0_2_ + sVar118) - sVar178;
      auVar195._2_2_ = (auVar115._2_2_ + sVar127) - sVar179;
      auVar195._4_2_ = (auVar115._4_2_ + sVar128) - sVar178;
      auVar195._6_2_ = (auVar115._6_2_ + sVar129) - sVar179;
      auVar195._8_2_ = (auVar115._8_2_ + sVar130) - sVar178;
      auVar195._10_2_ = (auVar115._10_2_ + sVar133) - sVar179;
      auVar195._12_2_ = (auVar115._12_2_ + sVar136) - sVar178;
      auVar195._14_2_ = (auVar115._14_2_ + sVar139) - sVar179;
      auVar170 = pabsw(auVar195,auVar195);
      auVar208._0_2_ = -(ushort)(auVar183._0_2_ < auVar221._0_2_);
      auVar208._2_2_ = -(ushort)(auVar183._2_2_ < auVar221._2_2_);
      auVar208._4_2_ = -(ushort)(auVar183._4_2_ < auVar221._4_2_);
      auVar208._6_2_ = -(ushort)(auVar183._6_2_ < auVar221._6_2_);
      auVar208._8_2_ = -(ushort)(auVar183._8_2_ < auVar221._8_2_);
      auVar208._10_2_ = -(ushort)(auVar183._10_2_ < auVar221._10_2_);
      auVar208._12_2_ = -(ushort)(auVar183._12_2_ < auVar221._12_2_);
      auVar208._14_2_ = -(ushort)(auVar183._14_2_ < auVar221._14_2_);
      auVar194._0_2_ = -(ushort)(auVar170._0_2_ < auVar221._0_2_);
      auVar194._2_2_ = -(ushort)(auVar170._2_2_ < auVar221._2_2_);
      auVar194._4_2_ = -(ushort)(auVar170._4_2_ < auVar221._4_2_);
      auVar194._6_2_ = -(ushort)(auVar170._6_2_ < auVar221._6_2_);
      auVar194._8_2_ = -(ushort)(auVar170._8_2_ < auVar221._8_2_);
      auVar194._10_2_ = -(ushort)(auVar170._10_2_ < auVar221._10_2_);
      auVar194._12_2_ = -(ushort)(auVar170._12_2_ < auVar221._12_2_);
      auVar194._14_2_ = -(ushort)(auVar170._14_2_ < auVar221._14_2_);
      auVar184._0_2_ = -(ushort)(auVar170._0_2_ < auVar183._0_2_);
      auVar184._2_2_ = -(ushort)(auVar170._2_2_ < auVar183._2_2_);
      auVar184._4_2_ = -(ushort)(auVar170._4_2_ < auVar183._4_2_);
      auVar184._6_2_ = -(ushort)(auVar170._6_2_ < auVar183._6_2_);
      auVar184._8_2_ = -(ushort)(auVar170._8_2_ < auVar183._8_2_);
      auVar184._10_2_ = -(ushort)(auVar170._10_2_ < auVar183._10_2_);
      auVar184._12_2_ = -(ushort)(auVar170._12_2_ < auVar183._12_2_);
      auVar184._14_2_ = -(ushort)(auVar170._14_2_ < auVar183._14_2_);
      auVar170._4_2_ = sVar178;
      auVar170._0_4_ = uVar114;
      auVar170._6_2_ = sVar179;
      auVar170._8_2_ = sVar178;
      auVar170._10_2_ = sVar179;
      auVar170._12_2_ = sVar178;
      auVar170._14_2_ = sVar179;
      auVar209._0_2_ = (auVar196._0_2_ + sVar118) - auVar152._0_2_;
      auVar209._2_2_ = (auVar196._2_2_ + sVar127) - (ushort)bVar153;
      auVar209._4_2_ = (auVar196._4_2_ + sVar128) - (ushort)bVar154;
      auVar209._6_2_ = (auVar196._6_2_ + sVar129) - (ushort)bVar155;
      auVar209._8_2_ = (auVar196._8_2_ + sVar130) - (ushort)bVar156;
      auVar209._10_2_ = (auVar196._10_2_ + sVar133) - (ushort)bVar157;
      auVar209._12_2_ = (auVar196._12_2_ + sVar136) - (ushort)bVar158;
      auVar209._14_2_ = (auVar196._14_2_ + sVar139) - (ushort)bVar159;
      auVar210 = pabsw(auVar209,auVar209);
      auVar198._0_2_ = (auVar196._0_2_ + sVar118) - sVar178;
      auVar198._2_2_ = (auVar196._2_2_ + sVar127) - sVar179;
      auVar198._4_2_ = (auVar196._4_2_ + sVar128) - sVar178;
      auVar198._6_2_ = (auVar196._6_2_ + sVar129) - sVar179;
      auVar198._8_2_ = (auVar196._8_2_ + sVar130) - sVar178;
      auVar198._10_2_ = (auVar196._10_2_ + sVar133) - sVar179;
      auVar198._12_2_ = (auVar196._12_2_ + sVar136) - sVar178;
      auVar198._14_2_ = (auVar196._14_2_ + sVar139) - sVar179;
      auVar183 = pabsw(auVar198,auVar198);
      local_f8 = auVar206._0_2_;
      sStack_f6 = auVar206._2_2_;
      sStack_f4 = auVar206._4_2_;
      sStack_f2 = auVar206._6_2_;
      sStack_f0 = auVar206._8_2_;
      sStack_ee = auVar206._10_2_;
      sStack_ec = auVar206._12_2_;
      sStack_ea = auVar206._14_2_;
      auVar222._0_2_ = -(ushort)(auVar210._0_2_ < local_f8);
      auVar222._2_2_ = -(ushort)(auVar210._2_2_ < sStack_f6);
      auVar222._4_2_ = -(ushort)(auVar210._4_2_ < sStack_f4);
      auVar222._6_2_ = -(ushort)(auVar210._6_2_ < sStack_f2);
      auVar222._8_2_ = -(ushort)(auVar210._8_2_ < sStack_f0);
      auVar222._10_2_ = -(ushort)(auVar210._10_2_ < sStack_ee);
      auVar222._12_2_ = -(ushort)(auVar210._12_2_ < sStack_ec);
      auVar222._14_2_ = -(ushort)(auVar210._14_2_ < sStack_ea);
      auVar197._0_2_ = -(ushort)(auVar183._0_2_ < local_f8);
      auVar197._2_2_ = -(ushort)(auVar183._2_2_ < sStack_f6);
      auVar197._4_2_ = -(ushort)(auVar183._4_2_ < sStack_f4);
      auVar197._6_2_ = -(ushort)(auVar183._6_2_ < sStack_f2);
      auVar197._8_2_ = -(ushort)(auVar183._8_2_ < sStack_f0);
      auVar197._10_2_ = -(ushort)(auVar183._10_2_ < sStack_ee);
      auVar197._12_2_ = -(ushort)(auVar183._12_2_ < sStack_ec);
      auVar197._14_2_ = -(ushort)(auVar183._14_2_ < sStack_ea);
      auVar211._0_2_ = -(ushort)(auVar183._0_2_ < auVar210._0_2_);
      auVar211._2_2_ = -(ushort)(auVar183._2_2_ < auVar210._2_2_);
      auVar211._4_2_ = -(ushort)(auVar183._4_2_ < auVar210._4_2_);
      auVar211._6_2_ = -(ushort)(auVar183._6_2_ < auVar210._6_2_);
      auVar211._8_2_ = -(ushort)(auVar183._8_2_ < auVar210._8_2_);
      auVar211._10_2_ = -(ushort)(auVar183._10_2_ < auVar210._10_2_);
      auVar211._12_2_ = -(ushort)(auVar183._12_2_ < auVar210._12_2_);
      auVar211._14_2_ = -(ushort)(auVar183._14_2_ < auVar210._14_2_);
      auVar183._4_2_ = sVar178;
      auVar183._0_4_ = uVar114;
      auVar183._6_2_ = sVar179;
      auVar183._8_2_ = sVar178;
      auVar183._10_2_ = sVar179;
      auVar183._12_2_ = sVar178;
      auVar183._14_2_ = sVar179;
      auVar195 = ~(auVar194 | auVar208) & auVar126 |
                 (~auVar184 & auVar141 | auVar170 & auVar184) & (auVar194 | auVar208);
      auVar198 = ~(auVar197 | auVar222) & auVar126 |
                 (~auVar211 & auVar152 | auVar183 & auVar211) & (auVar197 | auVar222);
      sVar1 = auVar195._0_2_;
      sVar4 = auVar195._2_2_;
      sVar7 = auVar195._4_2_;
      sVar10 = auVar195._6_2_;
      sVar13 = auVar195._8_2_;
      sVar16 = auVar195._10_2_;
      sVar19 = auVar195._12_2_;
      sVar22 = auVar195._14_2_;
      sVar25 = auVar198._0_2_;
      sVar29 = auVar198._2_2_;
      sVar33 = auVar198._4_2_;
      sVar37 = auVar198._6_2_;
      sVar41 = auVar198._8_2_;
      sVar45 = auVar198._10_2_;
      sVar49 = auVar198._12_2_;
      sVar53 = auVar198._14_2_;
      auVar185._0_2_ = (auVar213._0_2_ + sVar118) - auVar192._0_2_;
      auVar185._2_2_ = (auVar213._2_2_ + sVar127) - auVar88._2_2_;
      auVar185._4_2_ = (auVar213._4_2_ + sVar128) - auVar96._0_2_;
      auVar185._6_2_ = (auVar213._6_2_ + sVar129) - sVar220;
      auVar185._8_2_ = (auVar213._8_2_ + sVar130) - auVar84._8_2_;
      auVar185._10_2_ = (auVar213._10_2_ + sVar133) - auVar76._10_2_;
      auVar185._12_2_ = (auVar213._12_2_ + sVar136) - auVar66._12_2_;
      auVar185._14_2_ = (auVar213._14_2_ + sVar139) - (uVar65 >> 8);
      auVar183 = pabsw(auVar185,auVar185);
      auVar171._0_2_ = (auVar213._0_2_ + sVar118) - sVar178;
      auVar171._2_2_ = (auVar213._2_2_ + sVar127) - sVar179;
      auVar171._4_2_ = (auVar213._4_2_ + sVar128) - sVar178;
      auVar171._6_2_ = (auVar213._6_2_ + sVar129) - sVar179;
      auVar171._8_2_ = (auVar213._8_2_ + sVar130) - sVar178;
      auVar171._10_2_ = (auVar213._10_2_ + sVar133) - sVar179;
      auVar171._12_2_ = (auVar213._12_2_ + sVar136) - sVar178;
      auVar171._14_2_ = (auVar213._14_2_ + sVar139) - sVar179;
      auVar170 = pabsw(auVar171,auVar171);
      local_108 = auVar207._0_2_;
      sStack_106 = auVar207._2_2_;
      sStack_104 = auVar207._4_2_;
      sStack_102 = auVar207._6_2_;
      sStack_100 = auVar207._8_2_;
      sStack_fe = auVar207._10_2_;
      sStack_fc = auVar207._12_2_;
      sStack_fa = auVar207._14_2_;
      auVar199._0_2_ = -(ushort)(auVar183._0_2_ < local_108);
      auVar199._2_2_ = -(ushort)(auVar183._2_2_ < sStack_106);
      auVar199._4_2_ = -(ushort)(auVar183._4_2_ < sStack_104);
      auVar199._6_2_ = -(ushort)(auVar183._6_2_ < sStack_102);
      auVar199._8_2_ = -(ushort)(auVar183._8_2_ < sStack_100);
      auVar199._10_2_ = -(ushort)(auVar183._10_2_ < sStack_fe);
      auVar199._12_2_ = -(ushort)(auVar183._12_2_ < sStack_fc);
      auVar199._14_2_ = -(ushort)(auVar183._14_2_ < sStack_fa);
      auVar212._0_2_ = -(ushort)(auVar170._0_2_ < local_108);
      auVar212._2_2_ = -(ushort)(auVar170._2_2_ < sStack_106);
      auVar212._4_2_ = -(ushort)(auVar170._4_2_ < sStack_104);
      auVar212._6_2_ = -(ushort)(auVar170._6_2_ < sStack_102);
      auVar212._8_2_ = -(ushort)(auVar170._8_2_ < sStack_100);
      auVar212._10_2_ = -(ushort)(auVar170._10_2_ < sStack_fe);
      auVar212._12_2_ = -(ushort)(auVar170._12_2_ < sStack_fc);
      auVar212._14_2_ = -(ushort)(auVar170._14_2_ < sStack_fa);
      auVar186._0_2_ = -(ushort)(auVar170._0_2_ < auVar183._0_2_);
      auVar186._2_2_ = -(ushort)(auVar170._2_2_ < auVar183._2_2_);
      auVar186._4_2_ = -(ushort)(auVar170._4_2_ < auVar183._4_2_);
      auVar186._6_2_ = -(ushort)(auVar170._6_2_ < auVar183._6_2_);
      auVar186._8_2_ = -(ushort)(auVar170._8_2_ < auVar183._8_2_);
      auVar186._10_2_ = -(ushort)(auVar170._10_2_ < auVar183._10_2_);
      auVar186._12_2_ = -(ushort)(auVar170._12_2_ < auVar183._12_2_);
      auVar186._14_2_ = -(ushort)(auVar170._14_2_ < auVar183._14_2_);
      auVar210._4_2_ = sVar178;
      auVar210._0_4_ = uVar114;
      auVar210._6_2_ = sVar179;
      auVar210._8_2_ = sVar178;
      auVar210._10_2_ = sVar179;
      auVar210._12_2_ = sVar178;
      auVar210._14_2_ = sVar179;
      auVar200._0_2_ = (auVar120._0_2_ + sVar118) - auVar119._0_2_;
      auVar200._2_2_ = (auVar120._2_2_ + sVar127) - (ushort)bVar131;
      auVar200._4_2_ = (auVar120._4_2_ + sVar128) - (ushort)bVar132;
      auVar200._6_2_ = (auVar120._6_2_ + sVar129) - (ushort)bVar134;
      auVar200._8_2_ = (auVar120._8_2_ + sVar130) - (ushort)bVar135;
      auVar200._10_2_ = (auVar120._10_2_ + sVar133) - (ushort)bVar137;
      auVar200._12_2_ = (auVar120._12_2_ + sVar136) - (ushort)bVar138;
      auVar200._14_2_ = (auVar120._14_2_ + sVar139) - (ushort)bVar140;
      auVar183 = pabsw(auVar200,auVar200);
      auVar172._0_2_ = (auVar120._0_2_ + sVar118) - sVar178;
      auVar172._2_2_ = (auVar120._2_2_ + sVar127) - sVar179;
      auVar172._4_2_ = (auVar120._4_2_ + sVar128) - sVar178;
      auVar172._6_2_ = (auVar120._6_2_ + sVar129) - sVar179;
      auVar172._8_2_ = (auVar120._8_2_ + sVar130) - sVar178;
      auVar172._10_2_ = (auVar120._10_2_ + sVar133) - sVar179;
      auVar172._12_2_ = (auVar120._12_2_ + sVar136) - sVar178;
      auVar172._14_2_ = (auVar120._14_2_ + sVar139) - sVar179;
      auVar170 = pabsw(auVar172,auVar172);
      local_118 = auVar121._0_2_;
      sStack_116 = auVar121._2_2_;
      sStack_114 = auVar121._4_2_;
      sStack_112 = auVar121._6_2_;
      sStack_110 = auVar121._8_2_;
      sStack_10e = auVar121._10_2_;
      sStack_10c = auVar121._12_2_;
      sStack_10a = auVar121._14_2_;
      auVar223._0_2_ = -(ushort)(auVar183._0_2_ < local_118);
      auVar223._2_2_ = -(ushort)(auVar183._2_2_ < sStack_116);
      auVar223._4_2_ = -(ushort)(auVar183._4_2_ < sStack_114);
      auVar223._6_2_ = -(ushort)(auVar183._6_2_ < sStack_112);
      auVar223._8_2_ = -(ushort)(auVar183._8_2_ < sStack_110);
      auVar223._10_2_ = -(ushort)(auVar183._10_2_ < sStack_10e);
      auVar223._12_2_ = -(ushort)(auVar183._12_2_ < sStack_10c);
      auVar223._14_2_ = -(ushort)(auVar183._14_2_ < sStack_10a);
      auVar214._0_2_ = -(ushort)(auVar170._0_2_ < local_118);
      auVar214._2_2_ = -(ushort)(auVar170._2_2_ < sStack_116);
      auVar214._4_2_ = -(ushort)(auVar170._4_2_ < sStack_114);
      auVar214._6_2_ = -(ushort)(auVar170._6_2_ < sStack_112);
      auVar214._8_2_ = -(ushort)(auVar170._8_2_ < sStack_110);
      auVar214._10_2_ = -(ushort)(auVar170._10_2_ < sStack_10e);
      auVar214._12_2_ = -(ushort)(auVar170._12_2_ < sStack_10c);
      auVar214._14_2_ = -(ushort)(auVar170._14_2_ < sStack_10a);
      auVar201._0_2_ = -(ushort)(auVar170._0_2_ < auVar183._0_2_);
      auVar201._2_2_ = -(ushort)(auVar170._2_2_ < auVar183._2_2_);
      auVar201._4_2_ = -(ushort)(auVar170._4_2_ < auVar183._4_2_);
      auVar201._6_2_ = -(ushort)(auVar170._6_2_ < auVar183._6_2_);
      auVar201._8_2_ = -(ushort)(auVar170._8_2_ < auVar183._8_2_);
      auVar201._10_2_ = -(ushort)(auVar170._10_2_ < auVar183._10_2_);
      auVar201._12_2_ = -(ushort)(auVar170._12_2_ < auVar183._12_2_);
      auVar201._14_2_ = -(ushort)(auVar170._14_2_ < auVar183._14_2_);
      auVar215._4_2_ = sVar178;
      auVar215._0_4_ = uVar114;
      auVar215._6_2_ = sVar179;
      auVar215._8_2_ = sVar178;
      auVar215._10_2_ = sVar179;
      auVar215._12_2_ = sVar178;
      auVar215._14_2_ = sVar179;
      auVar210 = ~(auVar212 | auVar199) & auVar126 |
                 (~auVar186 & auVar192 | auVar210 & auVar186) & (auVar212 | auVar199);
      auVar215 = ~(auVar214 | auVar223) & auVar126 |
                 (~auVar201 & auVar119 | auVar215 & auVar201) & (auVar214 | auVar223);
      sVar2 = auVar210._0_2_;
      sVar5 = auVar210._2_2_;
      sVar8 = auVar210._4_2_;
      sVar11 = auVar210._6_2_;
      sVar14 = auVar210._8_2_;
      sVar17 = auVar210._10_2_;
      sVar20 = auVar210._12_2_;
      sVar23 = auVar210._14_2_;
      sVar26 = auVar215._0_2_;
      sVar30 = auVar215._2_2_;
      sVar34 = auVar215._4_2_;
      sVar38 = auVar215._6_2_;
      sVar42 = auVar215._8_2_;
      sVar46 = auVar215._10_2_;
      sVar50 = auVar215._12_2_;
      sVar54 = auVar215._14_2_;
      auVar187._0_2_ = (auVar169._0_2_ + sVar118) - auVar168._0_2_;
      auVar187._2_2_ = (auVar169._2_2_ + sVar127) - auVar89._2_2_;
      auVar187._4_2_ = (auVar169._4_2_ + sVar128) - auVar99._0_2_;
      auVar187._6_2_ = (auVar169._6_2_ + sVar129) - sVar177;
      auVar187._8_2_ = (auVar169._8_2_ + sVar130) - auVar85._8_2_;
      auVar187._10_2_ = (auVar169._10_2_ + sVar133) - auVar77._10_2_;
      auVar187._12_2_ = (auVar169._12_2_ + sVar136) - auVar68._12_2_;
      auVar187._14_2_ = (auVar169._14_2_ + sVar139) - (uVar67 >> 8);
      auVar183 = pabsw(auVar187,auVar187);
      auVar173._0_2_ = (auVar169._0_2_ + sVar118) - sVar178;
      auVar173._2_2_ = (auVar169._2_2_ + sVar127) - sVar179;
      auVar173._4_2_ = (auVar169._4_2_ + sVar128) - sVar178;
      auVar173._6_2_ = (auVar169._6_2_ + sVar129) - sVar179;
      auVar173._8_2_ = (auVar169._8_2_ + sVar130) - sVar178;
      auVar173._10_2_ = (auVar169._10_2_ + sVar133) - sVar179;
      auVar173._12_2_ = (auVar169._12_2_ + sVar136) - sVar178;
      auVar173._14_2_ = (auVar169._14_2_ + sVar139) - sVar179;
      auVar170 = pabsw(auVar173,auVar173);
      local_128 = auVar122._0_2_;
      sStack_126 = auVar122._2_2_;
      sStack_124 = auVar122._4_2_;
      sStack_122 = auVar122._6_2_;
      sStack_120 = auVar122._8_2_;
      sStack_11e = auVar122._10_2_;
      sStack_11c = auVar122._12_2_;
      sStack_11a = auVar122._14_2_;
      auVar202._0_2_ = -(ushort)(auVar183._0_2_ < local_128);
      auVar202._2_2_ = -(ushort)(auVar183._2_2_ < sStack_126);
      auVar202._4_2_ = -(ushort)(auVar183._4_2_ < sStack_124);
      auVar202._6_2_ = -(ushort)(auVar183._6_2_ < sStack_122);
      auVar202._8_2_ = -(ushort)(auVar183._8_2_ < sStack_120);
      auVar202._10_2_ = -(ushort)(auVar183._10_2_ < sStack_11e);
      auVar202._12_2_ = -(ushort)(auVar183._12_2_ < sStack_11c);
      auVar202._14_2_ = -(ushort)(auVar183._14_2_ < sStack_11a);
      auVar224._0_2_ = -(ushort)(auVar170._0_2_ < local_128);
      auVar224._2_2_ = -(ushort)(auVar170._2_2_ < sStack_126);
      auVar224._4_2_ = -(ushort)(auVar170._4_2_ < sStack_124);
      auVar224._6_2_ = -(ushort)(auVar170._6_2_ < sStack_122);
      auVar224._8_2_ = -(ushort)(auVar170._8_2_ < sStack_120);
      auVar224._10_2_ = -(ushort)(auVar170._10_2_ < sStack_11e);
      auVar224._12_2_ = -(ushort)(auVar170._12_2_ < sStack_11c);
      auVar224._14_2_ = -(ushort)(auVar170._14_2_ < sStack_11a);
      auVar188._0_2_ = -(ushort)(auVar170._0_2_ < auVar183._0_2_);
      auVar188._2_2_ = -(ushort)(auVar170._2_2_ < auVar183._2_2_);
      auVar188._4_2_ = -(ushort)(auVar170._4_2_ < auVar183._4_2_);
      auVar188._6_2_ = -(ushort)(auVar170._6_2_ < auVar183._6_2_);
      auVar188._8_2_ = -(ushort)(auVar170._8_2_ < auVar183._8_2_);
      auVar188._10_2_ = -(ushort)(auVar170._10_2_ < auVar183._10_2_);
      auVar188._12_2_ = -(ushort)(auVar170._12_2_ < auVar183._12_2_);
      auVar188._14_2_ = -(ushort)(auVar170._14_2_ < auVar183._14_2_);
      auVar225._4_2_ = sVar178;
      auVar225._0_4_ = uVar114;
      auVar225._6_2_ = sVar179;
      auVar225._8_2_ = sVar178;
      auVar225._10_2_ = sVar179;
      auVar225._12_2_ = sVar178;
      auVar225._14_2_ = sVar179;
      auVar203._0_2_ = (auVar142._0_2_ + sVar118) - auVar160._0_2_;
      auVar203._2_2_ = (auVar142._2_2_ + sVar127) - (ushort)bVar161;
      auVar203._4_2_ = (auVar142._4_2_ + sVar128) - (ushort)bVar162;
      auVar203._6_2_ = (auVar142._6_2_ + sVar129) - (ushort)bVar163;
      auVar203._8_2_ = (auVar142._8_2_ + sVar130) - (ushort)bVar164;
      auVar203._10_2_ = (auVar142._10_2_ + sVar133) - (ushort)bVar165;
      auVar203._12_2_ = (auVar142._12_2_ + sVar136) - (ushort)bVar166;
      auVar203._14_2_ = (auVar142._14_2_ + sVar139) - (ushort)bVar167;
      auVar183 = pabsw(auVar203,auVar203);
      auVar174._0_2_ = (auVar142._0_2_ + sVar118) - sVar178;
      auVar174._2_2_ = (auVar142._2_2_ + sVar127) - sVar179;
      auVar174._4_2_ = (auVar142._4_2_ + sVar128) - sVar178;
      auVar174._6_2_ = (auVar142._6_2_ + sVar129) - sVar179;
      auVar174._8_2_ = (auVar142._8_2_ + sVar130) - sVar178;
      auVar174._10_2_ = (auVar142._10_2_ + sVar133) - sVar179;
      auVar174._12_2_ = (auVar142._12_2_ + sVar136) - sVar178;
      auVar174._14_2_ = (auVar142._14_2_ + sVar139) - sVar179;
      auVar170 = pabsw(auVar174,auVar174);
      local_138 = auVar123._0_2_;
      sStack_136 = auVar123._2_2_;
      sStack_134 = auVar123._4_2_;
      sStack_132 = auVar123._6_2_;
      sStack_130 = auVar123._8_2_;
      sStack_12e = auVar123._10_2_;
      sStack_12c = auVar123._12_2_;
      sStack_12a = auVar123._14_2_;
      auVar216._0_2_ = -(ushort)(auVar183._0_2_ < local_138);
      auVar216._2_2_ = -(ushort)(auVar183._2_2_ < sStack_136);
      auVar216._4_2_ = -(ushort)(auVar183._4_2_ < sStack_134);
      auVar216._6_2_ = -(ushort)(auVar183._6_2_ < sStack_132);
      auVar216._8_2_ = -(ushort)(auVar183._8_2_ < sStack_130);
      auVar216._10_2_ = -(ushort)(auVar183._10_2_ < sStack_12e);
      auVar216._12_2_ = -(ushort)(auVar183._12_2_ < sStack_12c);
      auVar216._14_2_ = -(ushort)(auVar183._14_2_ < sStack_12a);
      auVar226._0_2_ = -(ushort)(auVar170._0_2_ < local_138);
      auVar226._2_2_ = -(ushort)(auVar170._2_2_ < sStack_136);
      auVar226._4_2_ = -(ushort)(auVar170._4_2_ < sStack_134);
      auVar226._6_2_ = -(ushort)(auVar170._6_2_ < sStack_132);
      auVar226._8_2_ = -(ushort)(auVar170._8_2_ < sStack_130);
      auVar226._10_2_ = -(ushort)(auVar170._10_2_ < sStack_12e);
      auVar226._12_2_ = -(ushort)(auVar170._12_2_ < sStack_12c);
      auVar226._14_2_ = -(ushort)(auVar170._14_2_ < sStack_12a);
      auVar204._0_2_ = -(ushort)(auVar170._0_2_ < auVar183._0_2_);
      auVar204._2_2_ = -(ushort)(auVar170._2_2_ < auVar183._2_2_);
      auVar204._4_2_ = -(ushort)(auVar170._4_2_ < auVar183._4_2_);
      auVar204._6_2_ = -(ushort)(auVar170._6_2_ < auVar183._6_2_);
      auVar204._8_2_ = -(ushort)(auVar170._8_2_ < auVar183._8_2_);
      auVar204._10_2_ = -(ushort)(auVar170._10_2_ < auVar183._10_2_);
      auVar204._12_2_ = -(ushort)(auVar170._12_2_ < auVar183._12_2_);
      auVar204._14_2_ = -(ushort)(auVar170._14_2_ < auVar183._14_2_);
      auVar227._4_2_ = sVar178;
      auVar227._0_4_ = uVar114;
      auVar227._6_2_ = sVar179;
      auVar227._8_2_ = sVar178;
      auVar227._10_2_ = sVar179;
      auVar227._12_2_ = sVar178;
      auVar227._14_2_ = sVar179;
      auVar225 = ~(auVar224 | auVar202) & auVar126 |
                 (~auVar188 & auVar168 | auVar225 & auVar188) & (auVar224 | auVar202);
      auVar183 = (~auVar204 & auVar160 | auVar227 & auVar204) & (auVar226 | auVar216);
      auVar227 = ~(auVar226 | auVar216) & auVar126 | auVar183;
      sVar3 = auVar225._0_2_;
      sVar6 = auVar225._2_2_;
      sVar9 = auVar225._4_2_;
      sVar12 = auVar225._6_2_;
      sVar15 = auVar225._8_2_;
      sVar18 = auVar225._10_2_;
      sVar21 = auVar225._12_2_;
      sVar24 = auVar225._14_2_;
      sVar27 = auVar227._0_2_;
      sVar31 = auVar227._2_2_;
      sVar35 = auVar227._4_2_;
      sVar39 = auVar227._6_2_;
      sVar43 = auVar227._8_2_;
      sVar47 = auVar227._10_2_;
      sVar51 = auVar227._12_2_;
      sVar55 = auVar227._14_2_;
      auVar175._0_2_ = (auVar181._0_2_ + sVar118) - auVar180._0_2_;
      auVar175._2_2_ = (auVar181._2_2_ + sVar127) - auVar90._2_2_;
      auVar175._4_2_ = (auVar181._4_2_ + sVar128) - auVar102._0_2_;
      auVar175._6_2_ = (auVar181._6_2_ + sVar129) - sVar191;
      auVar175._8_2_ = (auVar181._8_2_ + sVar130) - auVar86._8_2_;
      auVar175._10_2_ = (auVar181._10_2_ + sVar133) - auVar78._10_2_;
      auVar175._12_2_ = (auVar181._12_2_ + sVar136) - auVar70._12_2_;
      auVar175._14_2_ = (auVar181._14_2_ + sVar139) - (uVar69 >> 8);
      auVar170 = pabsw(auVar175,auVar175);
      auVar189._0_2_ = (auVar181._0_2_ + sVar118) - sVar178;
      auVar189._2_2_ = (auVar181._2_2_ + sVar127) - sVar179;
      auVar189._4_2_ = (auVar181._4_2_ + sVar128) - sVar178;
      auVar189._6_2_ = (auVar181._6_2_ + sVar129) - sVar179;
      auVar189._8_2_ = (auVar181._8_2_ + sVar130) - sVar178;
      auVar189._10_2_ = (auVar181._10_2_ + sVar133) - sVar179;
      auVar189._12_2_ = (auVar181._12_2_ + sVar136) - sVar178;
      auVar189._14_2_ = (auVar181._14_2_ + sVar139) - sVar179;
      auVar183 = pabsw(auVar183,auVar189);
      local_148 = auVar124._0_2_;
      sStack_146 = auVar124._2_2_;
      sStack_144 = auVar124._4_2_;
      sStack_142 = auVar124._6_2_;
      sStack_140 = auVar124._8_2_;
      sStack_13e = auVar124._10_2_;
      sStack_13c = auVar124._12_2_;
      sStack_13a = auVar124._14_2_;
      auVar217._0_2_ = -(ushort)(auVar170._0_2_ < local_148);
      auVar217._2_2_ = -(ushort)(auVar170._2_2_ < sStack_146);
      auVar217._4_2_ = -(ushort)(auVar170._4_2_ < sStack_144);
      auVar217._6_2_ = -(ushort)(auVar170._6_2_ < sStack_142);
      auVar217._8_2_ = -(ushort)(auVar170._8_2_ < sStack_140);
      auVar217._10_2_ = -(ushort)(auVar170._10_2_ < sStack_13e);
      auVar217._12_2_ = -(ushort)(auVar170._12_2_ < sStack_13c);
      auVar217._14_2_ = -(ushort)(auVar170._14_2_ < sStack_13a);
      auVar190._0_2_ = -(ushort)(auVar183._0_2_ < local_148);
      auVar190._2_2_ = -(ushort)(auVar183._2_2_ < sStack_146);
      auVar190._4_2_ = -(ushort)(auVar183._4_2_ < sStack_144);
      auVar190._6_2_ = -(ushort)(auVar183._6_2_ < sStack_142);
      auVar190._8_2_ = -(ushort)(auVar183._8_2_ < sStack_140);
      auVar190._10_2_ = -(ushort)(auVar183._10_2_ < sStack_13e);
      auVar190._12_2_ = -(ushort)(auVar183._12_2_ < sStack_13c);
      auVar190._14_2_ = -(ushort)(auVar183._14_2_ < sStack_13a);
      auVar176._0_2_ = -(ushort)(auVar183._0_2_ < auVar170._0_2_);
      auVar176._2_2_ = -(ushort)(auVar183._2_2_ < auVar170._2_2_);
      auVar176._4_2_ = -(ushort)(auVar183._4_2_ < auVar170._4_2_);
      auVar176._6_2_ = -(ushort)(auVar183._6_2_ < auVar170._6_2_);
      auVar176._8_2_ = -(ushort)(auVar183._8_2_ < auVar170._8_2_);
      auVar176._10_2_ = -(ushort)(auVar183._10_2_ < auVar170._10_2_);
      auVar176._12_2_ = -(ushort)(auVar183._12_2_ < auVar170._12_2_);
      auVar176._14_2_ = -(ushort)(auVar183._14_2_ < auVar170._14_2_);
      auVar57._4_2_ = sVar178;
      auVar57._0_4_ = uVar114;
      auVar57._6_2_ = sVar179;
      auVar57._8_2_ = sVar178;
      auVar57._10_2_ = sVar179;
      auVar57._12_2_ = sVar178;
      auVar57._14_2_ = sVar179;
      auVar218._0_2_ = (auVar193._0_2_ + sVar118) - auVar144._0_2_;
      auVar218._2_2_ = (auVar193._2_2_ + sVar127) - (ushort)bVar145;
      auVar218._4_2_ = (auVar193._4_2_ + sVar128) - (ushort)bVar146;
      auVar218._6_2_ = (auVar193._6_2_ + sVar129) - (ushort)bVar147;
      auVar218._8_2_ = (auVar193._8_2_ + sVar130) - (ushort)bVar148;
      auVar218._10_2_ = (auVar193._10_2_ + sVar133) - (ushort)bVar149;
      auVar218._12_2_ = (auVar193._12_2_ + sVar136) - (ushort)bVar150;
      auVar218._14_2_ = (auVar193._14_2_ + sVar139) - (ushort)bVar151;
      auVar183 = pabsw(auVar218,auVar218);
      auVar205._0_2_ = (auVar193._0_2_ + sVar118) - sVar178;
      auVar205._2_2_ = (auVar193._2_2_ + sVar127) - sVar179;
      auVar205._4_2_ = (auVar193._4_2_ + sVar128) - sVar178;
      auVar205._6_2_ = (auVar193._6_2_ + sVar129) - sVar179;
      auVar205._8_2_ = (auVar193._8_2_ + sVar130) - sVar178;
      auVar205._10_2_ = (auVar193._10_2_ + sVar133) - sVar179;
      auVar205._12_2_ = (auVar193._12_2_ + sVar136) - sVar178;
      auVar205._14_2_ = (auVar193._14_2_ + sVar139) - sVar179;
      auVar170 = pabsw(auVar205,auVar205);
      local_158 = auVar125._0_2_;
      sStack_156 = auVar125._2_2_;
      sStack_154 = auVar125._4_2_;
      sStack_152 = auVar125._6_2_;
      sStack_150 = auVar125._8_2_;
      sStack_14e = auVar125._10_2_;
      sStack_14c = auVar125._12_2_;
      sStack_14a = auVar125._14_2_;
      auVar228._0_2_ = -(ushort)(auVar183._0_2_ < local_158);
      auVar228._2_2_ = -(ushort)(auVar183._2_2_ < sStack_156);
      auVar228._4_2_ = -(ushort)(auVar183._4_2_ < sStack_154);
      auVar228._6_2_ = -(ushort)(auVar183._6_2_ < sStack_152);
      auVar228._8_2_ = -(ushort)(auVar183._8_2_ < sStack_150);
      auVar228._10_2_ = -(ushort)(auVar183._10_2_ < sStack_14e);
      auVar228._12_2_ = -(ushort)(auVar183._12_2_ < sStack_14c);
      auVar228._14_2_ = -(ushort)(auVar183._14_2_ < sStack_14a);
      auVar116._0_2_ = -(ushort)(auVar170._0_2_ < local_158);
      auVar116._2_2_ = -(ushort)(auVar170._2_2_ < sStack_156);
      auVar116._4_2_ = -(ushort)(auVar170._4_2_ < sStack_154);
      auVar116._6_2_ = -(ushort)(auVar170._6_2_ < sStack_152);
      auVar116._8_2_ = -(ushort)(auVar170._8_2_ < sStack_150);
      auVar116._10_2_ = -(ushort)(auVar170._10_2_ < sStack_14e);
      auVar116._12_2_ = -(ushort)(auVar170._12_2_ < sStack_14c);
      auVar116._14_2_ = -(ushort)(auVar170._14_2_ < sStack_14a);
      auVar219._0_2_ = -(ushort)(auVar170._0_2_ < auVar183._0_2_);
      auVar219._2_2_ = -(ushort)(auVar170._2_2_ < auVar183._2_2_);
      auVar219._4_2_ = -(ushort)(auVar170._4_2_ < auVar183._4_2_);
      auVar219._6_2_ = -(ushort)(auVar170._6_2_ < auVar183._6_2_);
      auVar219._8_2_ = -(ushort)(auVar170._8_2_ < auVar183._8_2_);
      auVar219._10_2_ = -(ushort)(auVar170._10_2_ < auVar183._10_2_);
      auVar219._12_2_ = -(ushort)(auVar170._12_2_ < auVar183._12_2_);
      auVar219._14_2_ = -(ushort)(auVar170._14_2_ < auVar183._14_2_);
      auVar58._4_2_ = sVar178;
      auVar58._0_4_ = uVar114;
      auVar58._6_2_ = sVar179;
      auVar58._8_2_ = sVar178;
      auVar58._10_2_ = sVar179;
      auVar58._12_2_ = sVar178;
      auVar58._14_2_ = sVar179;
      auVar183 = ~(auVar190 | auVar217) & auVar126 |
                 (~auVar176 & auVar180 | auVar57 & auVar176) & (auVar190 | auVar217);
      auVar170 = ~(auVar116 | auVar228) & auVar126 |
                 (~auVar219 & auVar144 | auVar58 & auVar219) & (auVar116 | auVar228);
      sVar118 = auVar183._0_2_;
      sVar127 = auVar183._2_2_;
      sVar128 = auVar183._4_2_;
      sVar129 = auVar183._6_2_;
      sVar130 = auVar183._8_2_;
      sVar133 = auVar183._10_2_;
      sVar136 = auVar183._12_2_;
      sVar139 = auVar183._14_2_;
      sVar28 = auVar170._0_2_;
      sVar32 = auVar170._2_2_;
      sVar36 = auVar170._4_2_;
      sVar40 = auVar170._6_2_;
      sVar44 = auVar170._8_2_;
      sVar48 = auVar170._10_2_;
      sVar52 = auVar170._12_2_;
      sVar56 = auVar170._14_2_;
      *dst = (0 < sVar1) * (sVar1 < 0x100) * auVar195[0] - (0xff < sVar1);
      dst[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar195[2] - (0xff < sVar4);
      dst[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar195[4] - (0xff < sVar7);
      dst[3] = (0 < sVar10) * (sVar10 < 0x100) * auVar195[6] - (0xff < sVar10);
      dst[4] = (0 < sVar13) * (sVar13 < 0x100) * auVar195[8] - (0xff < sVar13);
      dst[5] = (0 < sVar16) * (sVar16 < 0x100) * auVar195[10] - (0xff < sVar16);
      dst[6] = (0 < sVar19) * (sVar19 < 0x100) * auVar195[0xc] - (0xff < sVar19);
      dst[7] = (0 < sVar22) * (sVar22 < 0x100) * auVar195[0xe] - (0xff < sVar22);
      dst[8] = (0 < sVar25) * (sVar25 < 0x100) * auVar198[0] - (0xff < sVar25);
      dst[9] = (0 < sVar29) * (sVar29 < 0x100) * auVar198[2] - (0xff < sVar29);
      dst[10] = (0 < sVar33) * (sVar33 < 0x100) * auVar198[4] - (0xff < sVar33);
      dst[0xb] = (0 < sVar37) * (sVar37 < 0x100) * auVar198[6] - (0xff < sVar37);
      dst[0xc] = (0 < sVar41) * (sVar41 < 0x100) * auVar198[8] - (0xff < sVar41);
      dst[0xd] = (0 < sVar45) * (sVar45 < 0x100) * auVar198[10] - (0xff < sVar45);
      dst[0xe] = (0 < sVar49) * (sVar49 < 0x100) * auVar198[0xc] - (0xff < sVar49);
      dst[0xf] = (0 < sVar53) * (sVar53 < 0x100) * auVar198[0xe] - (0xff < sVar53);
      dst[0x10] = (0 < sVar2) * (sVar2 < 0x100) * auVar210[0] - (0xff < sVar2);
      dst[0x11] = (0 < sVar5) * (sVar5 < 0x100) * auVar210[2] - (0xff < sVar5);
      dst[0x12] = (0 < sVar8) * (sVar8 < 0x100) * auVar210[4] - (0xff < sVar8);
      dst[0x13] = (0 < sVar11) * (sVar11 < 0x100) * auVar210[6] - (0xff < sVar11);
      dst[0x14] = (0 < sVar14) * (sVar14 < 0x100) * auVar210[8] - (0xff < sVar14);
      dst[0x15] = (0 < sVar17) * (sVar17 < 0x100) * auVar210[10] - (0xff < sVar17);
      dst[0x16] = (0 < sVar20) * (sVar20 < 0x100) * auVar210[0xc] - (0xff < sVar20);
      dst[0x17] = (0 < sVar23) * (sVar23 < 0x100) * auVar210[0xe] - (0xff < sVar23);
      dst[0x18] = (0 < sVar26) * (sVar26 < 0x100) * auVar215[0] - (0xff < sVar26);
      dst[0x19] = (0 < sVar30) * (sVar30 < 0x100) * auVar215[2] - (0xff < sVar30);
      dst[0x1a] = (0 < sVar34) * (sVar34 < 0x100) * auVar215[4] - (0xff < sVar34);
      dst[0x1b] = (0 < sVar38) * (sVar38 < 0x100) * auVar215[6] - (0xff < sVar38);
      dst[0x1c] = (0 < sVar42) * (sVar42 < 0x100) * auVar215[8] - (0xff < sVar42);
      dst[0x1d] = (0 < sVar46) * (sVar46 < 0x100) * auVar215[10] - (0xff < sVar46);
      dst[0x1e] = (0 < sVar50) * (sVar50 < 0x100) * auVar215[0xc] - (0xff < sVar50);
      dst[0x1f] = (0 < sVar54) * (sVar54 < 0x100) * auVar215[0xe] - (0xff < sVar54);
      dst[0x20] = (0 < sVar3) * (sVar3 < 0x100) * auVar225[0] - (0xff < sVar3);
      dst[0x21] = (0 < sVar6) * (sVar6 < 0x100) * auVar225[2] - (0xff < sVar6);
      dst[0x22] = (0 < sVar9) * (sVar9 < 0x100) * auVar225[4] - (0xff < sVar9);
      dst[0x23] = (0 < sVar12) * (sVar12 < 0x100) * auVar225[6] - (0xff < sVar12);
      dst[0x24] = (0 < sVar15) * (sVar15 < 0x100) * auVar225[8] - (0xff < sVar15);
      dst[0x25] = (0 < sVar18) * (sVar18 < 0x100) * auVar225[10] - (0xff < sVar18);
      dst[0x26] = (0 < sVar21) * (sVar21 < 0x100) * auVar225[0xc] - (0xff < sVar21);
      dst[0x27] = (0 < sVar24) * (sVar24 < 0x100) * auVar225[0xe] - (0xff < sVar24);
      dst[0x28] = (0 < sVar27) * (sVar27 < 0x100) * auVar227[0] - (0xff < sVar27);
      dst[0x29] = (0 < sVar31) * (sVar31 < 0x100) * auVar227[2] - (0xff < sVar31);
      dst[0x2a] = (0 < sVar35) * (sVar35 < 0x100) * auVar227[4] - (0xff < sVar35);
      dst[0x2b] = (0 < sVar39) * (sVar39 < 0x100) * auVar227[6] - (0xff < sVar39);
      dst[0x2c] = (0 < sVar43) * (sVar43 < 0x100) * auVar227[8] - (0xff < sVar43);
      dst[0x2d] = (0 < sVar47) * (sVar47 < 0x100) * auVar227[10] - (0xff < sVar47);
      dst[0x2e] = (0 < sVar51) * (sVar51 < 0x100) * auVar227[0xc] - (0xff < sVar51);
      dst[0x2f] = (0 < sVar55) * (sVar55 < 0x100) * auVar227[0xe] - (0xff < sVar55);
      dst[0x30] = (0 < sVar118) * (sVar118 < 0x100) * auVar183[0] - (0xff < sVar118);
      dst[0x31] = (0 < sVar127) * (sVar127 < 0x100) * auVar183[2] - (0xff < sVar127);
      dst[0x32] = (0 < sVar128) * (sVar128 < 0x100) * auVar183[4] - (0xff < sVar128);
      dst[0x33] = (0 < sVar129) * (sVar129 < 0x100) * auVar183[6] - (0xff < sVar129);
      dst[0x34] = (0 < sVar130) * (sVar130 < 0x100) * auVar183[8] - (0xff < sVar130);
      dst[0x35] = (0 < sVar133) * (sVar133 < 0x100) * auVar183[10] - (0xff < sVar133);
      dst[0x36] = (0 < sVar136) * (sVar136 < 0x100) * auVar183[0xc] - (0xff < sVar136);
      dst[0x37] = (0 < sVar139) * (sVar139 < 0x100) * auVar183[0xe] - (0xff < sVar139);
      dst[0x38] = (0 < sVar28) * (sVar28 < 0x100) * auVar170[0] - (0xff < sVar28);
      dst[0x39] = (0 < sVar32) * (sVar32 < 0x100) * auVar170[2] - (0xff < sVar32);
      dst[0x3a] = (0 < sVar36) * (sVar36 < 0x100) * auVar170[4] - (0xff < sVar36);
      dst[0x3b] = (0 < sVar40) * (sVar40 < 0x100) * auVar170[6] - (0xff < sVar40);
      dst[0x3c] = (0 < sVar44) * (sVar44 < 0x100) * auVar170[8] - (0xff < sVar44);
      dst[0x3d] = (0 < sVar48) * (sVar48 < 0x100) * auVar170[10] - (0xff < sVar48);
      dst[0x3e] = (0 < sVar52) * (sVar52 < 0x100) * auVar170[0xc] - (0xff < sVar52);
      dst[0x3f] = (0 < sVar56) * (sVar56 < 0x100) * auVar170[0xe] - (0xff < sVar56);
      dst = dst + stride;
      auVar126._0_2_ = auVar143._0_2_ + 1;
      auVar126._2_2_ = auVar143._2_2_ + 1;
      auVar126._4_2_ = auVar143._4_2_ + 1;
      auVar126._6_2_ = auVar143._6_2_ + 1;
      auVar126._8_2_ = auVar143._8_2_ + 1;
      auVar126._10_2_ = auVar143._10_2_ + 1;
      auVar126._12_2_ = auVar143._12_2_ + 1;
      auVar126._14_2_ = auVar143._14_2_ + 1;
      iVar113 = iVar113 + -1;
      auVar143 = auVar126;
    } while (iVar113 != 0);
    lVar112 = lVar112 + 1;
  } while (lVar112 != 4);
  return;
}

Assistant:

void aom_paeth_predictor_64x64_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  const __m128i a = _mm_load_si128((const __m128i *)above);
  const __m128i b = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i c = _mm_load_si128((const __m128i *)(above + 32));
  const __m128i d = _mm_load_si128((const __m128i *)(above + 48));
  const __m128i zero = _mm_setzero_si128();
  const __m128i al = _mm_unpacklo_epi8(a, zero);
  const __m128i ah = _mm_unpackhi_epi8(a, zero);
  const __m128i bl = _mm_unpacklo_epi8(b, zero);
  const __m128i bh = _mm_unpackhi_epi8(b, zero);
  const __m128i cl = _mm_unpacklo_epi8(c, zero);
  const __m128i ch = _mm_unpackhi_epi8(c, zero);
  const __m128i dl = _mm_unpacklo_epi8(d, zero);
  const __m128i dh = _mm_unpackhi_epi8(d, zero);

  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l16;

  int i, j;
  for (j = 0; j < 4; ++j) {
    const __m128i l = _mm_load_si128((const __m128i *)(left + j * 16));
    __m128i rep = _mm_set1_epi16((short)0x8000);
    for (i = 0; i < 16; ++i) {
      l16 = _mm_shuffle_epi8(l, rep);
      const __m128i r0 = paeth_16x1_pred(&l16, &al, &ah, &tl16);
      const __m128i r1 = paeth_16x1_pred(&l16, &bl, &bh, &tl16);
      const __m128i r2 = paeth_16x1_pred(&l16, &cl, &ch, &tl16);
      const __m128i r3 = paeth_16x1_pred(&l16, &dl, &dh, &tl16);

      _mm_store_si128((__m128i *)dst, r0);
      _mm_store_si128((__m128i *)(dst + 16), r1);
      _mm_store_si128((__m128i *)(dst + 32), r2);
      _mm_store_si128((__m128i *)(dst + 48), r3);
      dst += stride;
      rep = _mm_add_epi16(rep, one);
    }
  }
}